

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O0

char * map2json_create(map2json_t *obj)

{
  map2json_tree_t *in_RDI;
  map2json_t *in_stack_00000040;
  
  map2json_freeTreeMemory((map2json_tree_t *)0x105932);
  map2json_createTree(in_stack_00000040);
  safe_strcpy((csafestring_t *)obj,(char *)in_RDI);
  map2json_createJsonString((csafestring_t *)obj,in_RDI);
  return *(char **)in_RDI->arrayId;
}

Assistant:

char *map2json_create(map2json_t *obj) {
	DEBUG_PUT("map2json_create([map2json_t *])... ");

	map2json_freeTreeMemory(obj->tree);

	map2json_createTree(obj);
	safe_strcpy(obj->buffer, "");
	map2json_createJsonString(obj->buffer, obj->tree);

	DEBUG_PUT("map2json_create([map2json_t *])... DONE");
	return obj->buffer->data;
}